

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O2

int CEcon::NewClientCallback(int ClientID,void *pUser)

{
  long lVar1;
  int64 iVar2;
  long lVar3;
  long in_FS_OFFSET;
  char aBuf [128];
  char aAddrStr [48];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  net_addr_str((NETADDR *)((long)pUser + (long)ClientID * 0x6a8 + 0x94),aAddrStr,0x30,1);
  str_format(aBuf,0x80,"client accepted. cid=%d addr=%s\'",(ulong)(uint)ClientID,aAddrStr);
  (**(code **)(**(long **)((long)pUser + 0x68) + 200))
            (*(long **)((long)pUser + 0x68),1,"econ",aBuf,0);
  lVar3 = (long)ClientID * 0x18;
  *(undefined4 *)((long)pUser + lVar3) = 1;
  iVar2 = time_get();
  *(int64 *)((long)pUser + lVar3 + 8) = iVar2;
  *(undefined4 *)((long)pUser + lVar3 + 0x10) = 0;
  CNetConsole::Send((CNetConsole *)((long)pUser + 0x78),ClientID,"Enter password:");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CEcon::NewClientCallback(int ClientID, void *pUser)
{
	CEcon *pThis = (CEcon *)pUser;

	char aAddrStr[NETADDR_MAXSTRSIZE];
	net_addr_str(pThis->m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "client accepted. cid=%d addr=%s'", ClientID, aAddrStr);
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "econ", aBuf);

	pThis->m_aClients[ClientID].m_State = CClient::STATE_CONNECTED;
	pThis->m_aClients[ClientID].m_TimeConnected = time_get();
	pThis->m_aClients[ClientID].m_AuthTries = 0;

	pThis->m_NetConsole.Send(ClientID, "Enter password:");
	return 0;
}